

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CNewArrayExpression *exp)

{
  bool bVar1;
  pointer pIVar2;
  TypeInfo local_140;
  TypeInfo local_118;
  CError local_f0;
  TypeInfo local_c0;
  undefined1 local_98 [8];
  string errorMessage;
  TypeInfo local_78;
  TypeInfo local_40;
  CNewArrayExpression *local_18;
  CNewArrayExpression *exp_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CNewArrayExpression *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CNewArrayExpression\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->lengthExpression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->lengthExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (bVar1) {
      return;
    }
  }
  TypeInfo::TypeInfo(&local_78,INT);
  bVar1 = ::operator!=(&this->lastCalculatedType,&local_78);
  TypeInfo::~TypeInfo(&local_78);
  if (bVar1) {
    TypeInfo::TypeInfo(&local_c0,INT);
    CError::GetTypeErrorMessage_abi_cxx11_((CError *)local_98,&local_c0,&this->lastCalculatedType);
    TypeInfo::~TypeInfo(&local_c0);
    CError::CError(&local_f0,(string *)local_98,
                   &(local_18->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_f0);
    CError::~CError(&local_f0);
    TypeInfo::TypeInfo(&local_118,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,&local_118);
    TypeInfo::~TypeInfo(&local_118);
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    TypeInfo::TypeInfo(&local_140,INT_ARRAY);
    TypeInfo::operator=(&this->lastCalculatedType,&local_140);
    TypeInfo::~TypeInfo(&local_140);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CNewArrayExpression &exp )
{
    std::cout << "typechecker: CNewArrayExpression\n";

    if ( exp.lengthExpression ) {
		exp.lengthExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	}
	if( lastCalculatedType != enums::TPrimitiveType::INT ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
	}
    lastCalculatedType = enums::TPrimitiveType::INT_ARRAY;
}